

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          value_type *value)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  long *plVar7;
  undefined4 extraout_var_01;
  locType *plVar8;
  locType extraout_RDX;
  long lVar9;
  locType wz;
  long lVar10;
  locType *plVar11;
  size_t sVar12;
  ulong uVar13;
  int iVar14;
  locType *plVar15;
  ulong uVar16;
  bool bVar17;
  pair<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  unsigned_long_long tmpk [100];
  long tmpv [100];
  int local_67c;
  ulong local_678;
  undefined1 local_670 [792];
  long local_358;
  undefined1 local_350 [800];
  node *pnVar6;
  undefined4 extraout_var_00;
  
  uVar2 = value->first;
  lVar10 = value->second;
  lVar5 = (long)this->depth;
  if (lVar5 == 0) {
    iVar3 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
    plVar7 = (long *)CONCAT44(extraout_var_00,iVar3);
    this->root = extraout_RDX;
    this->depth = 1;
    *(undefined4 *)(plVar7 + 200) = 1;
    plVar7[0x65] = uVar2;
    *plVar7 = lVar10;
    plVar7[100] = -1;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(this->file,&this->root);
    this->siz = 1;
  }
  else {
    uVar16 = lVar5 * 8;
    uVar13 = lVar5 << 2;
    if (this->depth < 0) {
      uVar16 = 0xffffffffffffffff;
      uVar13 = 0xffffffffffffffff;
    }
    pos = (locType *)operator_new__(uVar16);
    *pos = 0;
    p = (node **)operator_new__(uVar16);
    pp = (int *)operator_new__(uVar13);
    *pos = this->root;
    iVar3 = this->depth;
    plVar15 = pos;
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        iVar3 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])();
        pnVar6 = (node *)CONCAT44(extraout_var,iVar3);
        p[lVar5] = pnVar6;
        uVar1 = pnVar6->sz;
        plVar8 = (locType *)(ulong)uVar1;
        bVar17 = 0 < (int)uVar1;
        if ((int)uVar1 < 1) {
          plVar15 = (locType *)0x0;
        }
        else {
          plVar15 = (locType *)0x0;
          if (pnVar6->keyvalue[0] < uVar2) {
            plVar11 = (locType *)0x0;
            do {
              if ((locType *)((long)plVar8 - 1U) == plVar11) {
                bVar17 = (locType *)((long)plVar11 + 1U) < plVar8;
                plVar15 = (locType *)(ulong)uVar1;
                goto LAB_0010b0d5;
              }
              plVar15 = (locType *)((long)plVar11 + 1);
              lVar9 = (long)plVar11 + 1;
              plVar11 = plVar15;
            } while (pnVar6->keyvalue[lVar9] < uVar2);
            bVar17 = plVar15 < plVar8;
          }
        }
LAB_0010b0d5:
        if (lVar5 < (long)this->depth + -1) {
          if (bVar17) {
            plVar15 = (locType *)
                      (ulong)(((int)plVar15 + 1) -
                             (uint)(uVar2 < pnVar6->keyvalue[(ulong)plVar15 & 0xffffffff]));
          }
          pos[lVar5 + 1] = (pnVar6->field_0).val[(int)plVar15];
        }
        pp[lVar5] = (int)plVar15;
        lVar5 = lVar5 + 1;
        iVar3 = this->depth;
      } while (lVar5 < iVar3);
    }
    pnVar6 = p[(long)iVar3 + -1];
    iVar14 = (int)plVar15;
    if ((iVar14 < pnVar6->sz) && (pnVar6->keyvalue[iVar14] <= uVar2)) {
      operator_delete__(p);
      operator_delete__(pp);
      operator_delete__(pos);
      return false;
    }
    if (1 < iVar3 && iVar14 == 0) {
      plVar8 = pos + (iVar3 - 2);
      lVar5 = (ulong)(iVar3 - 2) + 1;
      do {
        lVar9 = (long)pp[lVar5 + -1];
        if ((lVar9 != 0) && (p[lVar5 + -1]->keyvalue[lVar9 + -1] == pnVar6->keyvalue[0])) {
          p[lVar5 + -1]->keyvalue[lVar9 + -1] = uVar2;
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(this->file,plVar8);
          break;
        }
        plVar8 = plVar8 + -1;
        lVar9 = lVar5 + -1;
        bVar17 = 0 < lVar5;
        lVar5 = lVar9;
      } while (lVar9 != 0 && bVar17);
    }
    lVar5 = (long)p[(long)iVar3 + -1]->sz;
    if (lVar5 < 99) {
      if (iVar14 < p[(long)iVar3 + -1]->sz) {
        do {
          pnVar6 = p[(long)iVar3 + -1];
          pnVar6->keyvalue[lVar5] = pnVar6->keyvalue[lVar5 + -1];
          (pnVar6->field_0).val[lVar5] = *(long *)((long)pnVar6 + lVar5 * 8 + -8);
          lVar5 = lVar5 + -1;
        } while (iVar14 < lVar5);
      }
      pnVar6 = p[(long)iVar3 + -1];
      pnVar6->keyvalue[iVar14] = uVar2;
      (pnVar6->field_0).val[iVar14] = lVar10;
      p[(long)iVar3 + -1]->sz = p[(long)iVar3 + -1]->sz + 1;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
    }
    else {
      iVar4 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[1])();
      lVar5 = CONCAT44(extraout_var_01,iVar4);
      if (0 < iVar14) {
        pnVar6 = p[(long)iVar3 + -1];
        sVar12 = ((ulong)plVar15 & 0xffffffff) << 3;
        memcpy(&local_358,pnVar6,sVar12);
        memcpy(&local_678,pnVar6->keyvalue,sVar12);
      }
      lVar9 = (long)iVar14;
      *(long *)(local_350 + lVar9 * 8 + -8) = lVar10;
      *(ulong *)(local_670 + lVar9 * 8 + -8) = uVar2;
      if (iVar14 < 99) {
        pnVar6 = p[(long)iVar3 + -1];
        sVar12 = (ulong)(0x62 - iVar14) * 8 + 8;
        memcpy(local_350 + lVar9 * 8,(void *)((long)&pnVar6->field_0 + lVar9 * 8),sVar12);
        memcpy(local_670 + lVar9 * 8,pnVar6->keyvalue + lVar9,sVar12);
      }
      pnVar6 = p[(long)iVar3 + -1];
      *(locType *)(lVar5 + 800) = pnVar6->nxt;
      pnVar6->sz = 0x32;
      pnVar6 = p[(long)iVar3 + -1];
      iVar14 = pnVar6->sz;
      if (0 < iVar14) {
        lVar10 = 0;
        do {
          (pnVar6->field_0).val[lVar10] = *(long *)(local_350 + lVar10 * 8 + -8);
          pnVar6 = p[(long)iVar3 + -1];
          pnVar6->keyvalue[lVar10] = *(unsigned_long_long *)(local_670 + lVar10 * 8 + -8);
          lVar10 = lVar10 + 1;
          iVar14 = pnVar6->sz;
        } while (lVar10 < iVar14);
      }
      pnVar6->nxt = wz;
      if (iVar14 < 100) {
        lVar10 = (long)iVar14;
        lVar9 = lVar10 * 8 + lVar5;
        do {
          *(undefined8 *)(lVar9 + (long)p[(long)iVar3 + -1]->sz * -8) =
               *(undefined8 *)(local_350 + lVar10 * 8 + -8);
          *(undefined8 *)(lVar9 + 0x328 + (long)p[(long)iVar3 + -1]->sz * -8) =
               *(undefined8 *)(local_670 + lVar10 * 8 + -8);
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 8;
        } while ((int)lVar10 != 100);
      }
      *(int *)(lVar5 + 0x640) = 100 - p[(long)iVar3 + -1]->sz;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])();
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
      local_67c = this->depth + -2;
      insertnonleaf(this,(unsigned_long_long *)(lVar5 + 0x328),&local_67c,p,pp,pos,wz);
    }
    operator_delete__(p);
    operator_delete__(pp);
    operator_delete__(pos);
    this->siz = this->siz + 1;
  }
  return true;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }